

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslayoutitem.cpp
# Opt level: O3

void __thiscall
QGraphicsLayoutItemPrivate::setSizeComponent
          (QGraphicsLayoutItemPrivate *this,SizeHint which,SizeComponent component,qreal value)

{
  double dVar1;
  QGraphicsLayoutItem *pQVar2;
  QSizeF *pQVar3;
  QSizeF *pQVar4;
  
  pQVar4 = this->userSizeHints;
  pQVar2 = this->q_ptr;
  if (pQVar4 == (QSizeF *)0x0) {
    pQVar4 = (QSizeF *)operator_new__(0x40);
    pQVar4[1].wd = -1.0;
    pQVar4[1].ht = -1.0;
    pQVar4->wd = -1.0;
    pQVar4->ht = -1.0;
    pQVar4[3].wd = -1.0;
    pQVar4[3].ht = -1.0;
    pQVar4[2].wd = -1.0;
    pQVar4[2].ht = -1.0;
    this->userSizeHints = pQVar4;
  }
  pQVar3 = (QSizeF *)&pQVar4->ht;
  if (component == Width) {
    pQVar3 = pQVar4;
  }
  dVar1 = pQVar3[which].wd;
  if ((dVar1 == value) && (!NAN(dVar1) && !NAN(value))) {
    return;
  }
  pQVar3[which].wd = value;
  (*pQVar2->_vptr_QGraphicsLayoutItem[4])(pQVar2);
  return;
}

Assistant:

void QGraphicsLayoutItemPrivate::setSizeComponent(
    Qt::SizeHint which, SizeComponent component, qreal value)
{
    Q_Q(QGraphicsLayoutItem);
    ensureUserSizeHints();
    qreal &userValue = (component == Width)
        ? userSizeHints[which].rwidth()
        : userSizeHints[which].rheight();
    if (value == userValue)
        return;
    userValue = value;
    q->updateGeometry();
}